

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify-tool.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uchar *data;
  char *__ptr;
  char *pubkey;
  int in_EDI;
  int ret;
  char *signature;
  char *public_key;
  char *file_contents;
  size_t file_len;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  uint local_4;
  
  if (in_EDI == 4) {
    data = (uchar *)read_file(in_stack_ffffffffffffffd0,
                              (size_t *)
                              CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    __ptr = read_file(in_stack_ffffffffffffffd0,
                      (size_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    pubkey = read_file(in_stack_ffffffffffffffd0,
                       (size_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    iVar1 = dsa_verify_blob(data,(size_t)__ptr,pubkey,
                            (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if (iVar1 == 1) {
      puts("Verification OK");
    }
    else {
      puts("Verification FAILED");
      switch(iVar1) {
      case 0:
        break;
      case -5:
        puts("Signature is invalid!");
        break;
      case -4:
        puts("Signature format is invalid!");
        break;
      case -3:
        puts("Key is invalid!");
        break;
      case -2:
        puts("Key format is invalid!");
      }
    }
    free(data);
    free(__ptr);
    free(pubkey);
    local_4 = (uint)((iVar1 == 1 ^ 0xffU) & 1);
  }
  else {
    puts("DSA verification tool");
    puts("Usage: ./dsa-verify <file> <public key> <signature>");
    local_4 = 0xffffffff;
  }
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
	if(argc != 4)
	{
		puts("DSA verification tool");
		puts("Usage: ./dsa-verify <file> <public key> <signature>");
		return -1;
	}

	size_t file_len;
	char* file_contents = read_file(argv[1], &file_len);
	char* public_key = read_file(argv[2], NULL);
	char* signature = read_file(argv[3], NULL);

	int ret = dsa_verify_blob((const unsigned char*)file_contents, file_len, public_key, signature);

	if (ret == DSA_VERIFICATION_OK)
		puts("Verification OK");
	else
	{
		puts("Verification FAILED");

		switch (ret)
		{
			case DSA_VERIFICATION_FAILED: break;
			case DSA_KEY_PARAM_ERROR: puts("Key is invalid!"); break;
			case DSA_SIGNATURE_PARAM_ERROR: puts("Signature is invalid!"); break;
			case DSA_KEY_FORMAT_ERROR: puts("Key format is invalid!"); break;
			case DSA_SIGNATURE_FORMAT_ERROR: puts("Signature format is invalid!"); break;
		}
	}

	free(file_contents);
	free(public_key);
	free(signature);

	return !(ret == DSA_VERIFICATION_OK);
}